

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectSeq_rec(Gia_Man_t *p,int Id,Vec_Int_t *vRoots,Vec_Int_t *vObjs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  
  iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar2 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,Id);
  pGVar5 = Gia_ManObj(p,Id);
  uVar3 = (uint)*(ulong *)pGVar5;
  uVar6 = *(ulong *)pGVar5 & 0x1fffffff;
  if (uVar6 == 0x1fffffff || (int)uVar3 < 0) {
    if ((~uVar3 & 0x9fffffff) == 0) {
      iVar2 = Gia_ObjIsRo(p,pGVar5);
      if (iVar2 != 0) {
        iVar2 = Gia_ObjIsRo(p,pGVar5);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->vCos->nSize;
        iVar1 = p->vCis->nSize;
        iVar4 = Gia_ObjCioId(pGVar5);
        pGVar5 = Gia_ManCo(p,(iVar2 - iVar1) + iVar4);
        iVar2 = Gia_ObjId(p,pGVar5);
        Vec_IntPush(vRoots,iVar2);
      }
      goto LAB_005c63d9;
    }
    if ((-1 < (int)uVar3) || ((int)uVar6 == 0x1fffffff)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                    ,0x204,"void Gia_ManCollectSeq_rec(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)")
      ;
    }
  }
  else {
    Gia_ManCollectSeq_rec(p,Id - (uVar3 & 0x1fffffff),vRoots,vObjs);
    uVar3 = *(uint *)&pGVar5->field_0x4;
  }
  Gia_ManCollectSeq_rec(p,Id - (uVar3 & 0x1fffffff),vRoots,vObjs);
LAB_005c63d9:
  Vec_IntPush(vObjs,Id);
  return;
}

Assistant:

void Gia_ManCollectSeq_rec( Gia_Man_t * p, int Id, Vec_Int_t * vRoots, Vec_Int_t * vObjs )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
        return;
    Gia_ObjSetTravIdCurrentId( p, Id );
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId1(pObj, Id), vRoots, vObjs );
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsRo(p, pObj) )
            Vec_IntPush( vRoots, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
    }
    else if ( Gia_ObjIsCo(pObj) )
        Gia_ManCollectSeq_rec( p, Gia_ObjFaninId0(pObj, Id), vRoots, vObjs );
    else assert( 0 );
    Vec_IntPush( vObjs, Id );
}